

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

int RemapMemBuffer(MemBuffer_conflict *mem,uint8_t *data,size_t size)

{
  bool bVar1;
  size_t size_local;
  uint8_t *data_local;
  MemBuffer_conflict *mem_local;
  uint local_4;
  
  bVar1 = mem->buf_size_ <= size;
  if (bVar1) {
    mem->buf_ = data;
    mem->buf_size_ = size;
    mem->end_ = size;
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static int RemapMemBuffer(WebPIDecoder* const idec,
                          const uint8_t* const data, size_t data_size) {
  MemBuffer* const mem = &idec->mem_;
  const uint8_t* const old_buf = mem->buf_;
  const uint8_t* const old_start =
      (old_buf == NULL) ? NULL : old_buf + mem->start_;
  assert(old_buf != NULL || mem->start_ == 0);
  assert(mem->mode_ == MEM_MODE_MAP);

  if (data_size < mem->buf_size_) return 0;  // can't remap to a shorter buffer!

  mem->buf_ = (uint8_t*)data;
  mem->end_ = mem->buf_size_ = data_size;

  DoRemap(idec, mem->buf_ + mem->start_ - old_start);
  return 1;
}